

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O0

int DSA_SIG_marshal(CBB *cbb,DSA_SIG *sig)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB child;
  DSA_SIG *sig_local;
  CBB *cbb_local;
  
  child.u._24_8_ = sig;
  iVar1 = CBB_add_asn1(cbb,(CBB *)local_50,0x20000010);
  if ((((iVar1 != 0) &&
       (iVar1 = marshal_integer((CBB *)local_50,*(BIGNUM **)child.u._24_8_), iVar1 != 0)) &&
      (iVar1 = marshal_integer((CBB *)local_50,*(BIGNUM **)(child.u._24_8_ + 8)), iVar1 != 0)) &&
     (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
    return 1;
  }
  ERR_put_error(10,0,0x6a,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                ,0x84);
  return 0;
}

Assistant:

int DSA_SIG_marshal(CBB *cbb, const DSA_SIG *sig) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_SEQUENCE) ||
      !marshal_integer(&child, sig->r) ||
      !marshal_integer(&child, sig->s) ||
      !CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_ENCODE_ERROR);
    return 0;
  }
  return 1;
}